

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  undefined8 *puVar1;
  size_type *psVar2;
  tm *ptVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  time_t seconds;
  ulong *local_220;
  long local_218;
  ulong local_210;
  long lStack_208;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  int local_5c;
  long local_58;
  string local_50;
  
  local_58 = (long)this / 1000;
  ptVar3 = localtime(&local_58);
  if (ptVar3 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_5c = ptVar3->tm_year + 0x76c;
  StreamableToString<int>(&local_50,&local_5c);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_170 = *puVar6;
    lStack_168 = plVar4[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *puVar6;
    local_180 = (ulong *)*plVar4;
  }
  local_178 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_(&local_80,(String *)(ulong)(ptVar3->tm_mon + 1),(int)local_178)
  ;
  uVar7 = 0xf;
  if (local_180 != &local_170) {
    uVar7 = local_170;
  }
  if (uVar7 < local_80._M_string_length + local_178) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar8 = local_80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_80._M_string_length + local_178) goto LAB_00146484;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_180);
  }
  else {
LAB_00146484:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_80._M_dataplus._M_p);
  }
  local_200 = &local_1f0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_1f0 = *puVar1;
    uStack_1e8 = puVar5[3];
  }
  else {
    local_1f0 = *puVar1;
    local_200 = (undefined8 *)*puVar5;
  }
  local_1f8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_200);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_210 = *puVar6;
    lStack_208 = plVar4[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *puVar6;
    local_220 = (ulong *)*plVar4;
  }
  local_218 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_a0,(String *)(ulong)(uint)ptVar3->tm_mday,(int)local_218);
  uVar7 = 0xf;
  if (local_220 != &local_210) {
    uVar7 = local_210;
  }
  if (uVar7 < local_a0._M_string_length + local_218) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar8 = local_a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_a0._M_string_length + local_218) goto LAB_001465a7;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_220);
  }
  else {
LAB_001465a7:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_a0._M_dataplus._M_p);
  }
  local_1e0 = &local_1d0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_1d0 = *puVar1;
    uStack_1c8 = puVar5[3];
  }
  else {
    local_1d0 = *puVar1;
    local_1e0 = (undefined8 *)*puVar5;
  }
  local_1d8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_150 = *puVar6;
    lStack_148 = plVar4[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar6;
    local_160 = (ulong *)*plVar4;
  }
  local_158 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_c0,(String *)(ulong)(uint)ptVar3->tm_hour,(int)local_158);
  uVar7 = 0xf;
  if (local_160 != &local_150) {
    uVar7 = local_150;
  }
  if (uVar7 < local_c0._M_string_length + local_158) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      uVar8 = local_c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_c0._M_string_length + local_158) goto LAB_001466db;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_160);
  }
  else {
LAB_001466db:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_c0._M_dataplus._M_p);
  }
  local_1c0 = &local_1b0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_1b0 = *puVar1;
    uStack_1a8 = puVar5[3];
  }
  else {
    local_1b0 = *puVar1;
    local_1c0 = (undefined8 *)*puVar5;
  }
  local_1b8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_130 = *puVar6;
    lStack_128 = plVar4[3];
    local_140 = &local_130;
  }
  else {
    local_130 = *puVar6;
    local_140 = (ulong *)*plVar4;
  }
  local_138 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_(&local_e0,(String *)(ulong)(uint)ptVar3->tm_min,(int)local_138)
  ;
  uVar7 = 0xf;
  if (local_140 != &local_130) {
    uVar7 = local_130;
  }
  if (uVar7 < local_e0._M_string_length + local_138) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar8 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_e0._M_string_length + local_138) goto LAB_00146811;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_140);
  }
  else {
LAB_00146811:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_e0._M_dataplus._M_p);
  }
  local_1a0 = &local_190;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_190 = *puVar1;
    uStack_188 = puVar5[3];
  }
  else {
    local_190 = *puVar1;
    local_1a0 = (undefined8 *)*puVar5;
  }
  local_198 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_110 = *puVar6;
    lStack_108 = plVar4[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar6;
    local_120 = (ulong *)*plVar4;
  }
  local_118 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_100,(String *)(ulong)(uint)ptVar3->tm_sec,(int)local_118);
  uVar7 = 0xf;
  if (local_120 != &local_110) {
    uVar7 = local_110;
  }
  if (uVar7 < local_100._M_string_length + local_118) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      uVar8 = local_100.field_2._M_allocated_capacity;
    }
    if (local_100._M_string_length + local_118 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_120);
      goto LAB_00146980;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100._M_dataplus._M_p);
LAB_00146980:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar2) {
    uVar8 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  // Using non-reentrant version as localtime_r is not portable.
  time_t seconds = static_cast<time_t>(ms / 1000);
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4996)  // Temporarily disables warning 4996
                                // (function or variable may be unsafe).
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
# pragma warning(pop)           // Restores the warning state again.
#else
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
#endif
  if (time_struct == NULL)
    return "";  // Invalid ms value

  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct->tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct->tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct->tm_mday) + "T" +
      String::FormatIntWidth2(time_struct->tm_hour) + ":" +
      String::FormatIntWidth2(time_struct->tm_min) + ":" +
      String::FormatIntWidth2(time_struct->tm_sec);
}